

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

void __thiscall
icu_63::CollationBuilder::addTailComposites
          (CollationBuilder *this,UnicodeString *nfdPrefix,UnicodeString *nfdString,
          UErrorCode *errorCode)

{
  short sVar1;
  UChar32 composite;
  UBool UVar2;
  uint c;
  int iVar3;
  int32_t indexAfterLastStarter;
  int32_t newCEsLength;
  uint32_t ce32;
  UnicodeString newNFDString;
  UnicodeString newString;
  UnicodeSetIterator iter;
  UnicodeString decomp;
  UnicodeSet composites;
  int64_t newCEs [31];
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = (nfdString->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      indexAfterLastStarter = (nfdString->fUnion).fFields.fLength;
    }
    else {
      indexAfterLastStarter = (int)sVar1 >> 5;
    }
    for (; indexAfterLastStarter != 0;
        indexAfterLastStarter = (c < 0x10000 | 0xfffffffe) + indexAfterLastStarter) {
      c = UnicodeString::char32At(nfdString,indexAfterLastStarter + -1);
      iVar3 = (*(this->nfd->super_UObject)._vptr_UObject[10])(this->nfd,(ulong)c);
      if ((char)iVar3 == '\0') {
        if (0xffffffec < c - 0x1113) {
          return;
        }
        UnicodeSet::UnicodeSet(&composites);
        UVar2 = Normalizer2Impl::getCanonStartSet(this->nfcImpl,c,&composites);
        if (UVar2 != '\0') {
          decomp.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_003b1268;
          decomp.fUnion.fStackFields.fLengthAndFlags = 2;
          newNFDString.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_003b1268;
          newNFDString.fUnion.fStackFields.fLengthAndFlags = 2;
          newString.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_003b1268;
          newString.fUnion.fStackFields.fLengthAndFlags = 2;
          UnicodeSetIterator::UnicodeSetIterator(&iter,&composites);
          while (UVar2 = UnicodeSetIterator::next(&iter), composite = iter.codepoint, UVar2 != '\0')
          {
            (*(this->nfd->super_UObject)._vptr_UObject[7])
                      (this->nfd,(ulong)(uint)iter.codepoint,&decomp);
            UVar2 = mergeCompositeIntoString
                              (this,nfdString,indexAfterLastStarter,composite,&decomp,&newNFDString,
                               &newString,errorCode);
            if (((UVar2 != '\0') &&
                (newCEsLength = CollationDataBuilder::getCEs
                                          (this->dataBuilder,nfdPrefix,&newNFDString,newCEs,0),
                newCEsLength < 0x20)) &&
               (ce32 = addIfDifferent(this,nfdPrefix,&newString,newCEs,newCEsLength,0xffffffff,
                                      errorCode), ce32 != 0xffffffff)) {
              addOnlyClosure(this,nfdPrefix,&newNFDString,newCEs,newCEsLength,ce32,errorCode);
            }
          }
          UnicodeSetIterator::~UnicodeSetIterator(&iter);
          UnicodeString::~UnicodeString(&newString);
          UnicodeString::~UnicodeString(&newNFDString);
          UnicodeString::~UnicodeString(&decomp);
        }
        UnicodeSet::~UnicodeSet(&composites);
        return;
      }
    }
  }
  return;
}

Assistant:

void
CollationBuilder::addTailComposites(const UnicodeString &nfdPrefix, const UnicodeString &nfdString,
                                    UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }

    // Look for the last starter in the NFD string.
    UChar32 lastStarter;
    int32_t indexAfterLastStarter = nfdString.length();
    for(;;) {
        if(indexAfterLastStarter == 0) { return; }  // no starter at all
        lastStarter = nfdString.char32At(indexAfterLastStarter - 1);
        if(nfd.getCombiningClass(lastStarter) == 0) { break; }
        indexAfterLastStarter -= U16_LENGTH(lastStarter);
    }
    // No closure to Hangul syllables since we decompose them on the fly.
    if(Hangul::isJamoL(lastStarter)) { return; }

    // Are there any composites whose decomposition starts with the lastStarter?
    // Note: Normalizer2Impl does not currently return start sets for NFC_QC=Maybe characters.
    // We might find some more equivalent mappings here if it did.
    UnicodeSet composites;
    if(!nfcImpl.getCanonStartSet(lastStarter, composites)) { return; }

    UnicodeString decomp;
    UnicodeString newNFDString, newString;
    int64_t newCEs[Collation::MAX_EXPANSION_LENGTH];
    UnicodeSetIterator iter(composites);
    while(iter.next()) {
        U_ASSERT(!iter.isString());
        UChar32 composite = iter.getCodepoint();
        nfd.getDecomposition(composite, decomp);
        if(!mergeCompositeIntoString(nfdString, indexAfterLastStarter, composite, decomp,
                                     newNFDString, newString, errorCode)) {
            continue;
        }
        int32_t newCEsLength = dataBuilder->getCEs(nfdPrefix, newNFDString, newCEs, 0);
        if(newCEsLength > Collation::MAX_EXPANSION_LENGTH) {
            // Ignore mappings that we cannot store.
            continue;
        }
        // Note: It is possible that the newCEs do not make use of the mapping
        // for which we are adding the tail composites, in which case we might be adding
        // unnecessary mappings.
        // For example, when we add tail composites for ae^ (^=combining circumflex),
        // UCA discontiguous-contraction matching does not find any matches
        // for ae_^ (_=any combining diacritic below) *unless* there is also
        // a contraction mapping for ae.
        // Thus, if there is no ae contraction, then the ae^ mapping is ignored
        // while fetching the newCEs for ae_^.
        // TODO: Try to detect this effectively.
        // (Alternatively, print a warning when prefix contractions are missing.)

        // We do not need an explicit mapping for the NFD strings.
        // It is fine if the NFD input collates like this via a sequence of mappings.
        // It also saves a little bit of space, and may reduce the set of characters with contractions.
        uint32_t ce32 = addIfDifferent(nfdPrefix, newString,
                                       newCEs, newCEsLength, Collation::UNASSIGNED_CE32, errorCode);
        if(ce32 != Collation::UNASSIGNED_CE32) {
            // was different, was added
            addOnlyClosure(nfdPrefix, newNFDString, newCEs, newCEsLength, ce32, errorCode);
        }
    }
}